

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.cpp
# Opt level: O2

char * __thiscall opencollada::MissingArgumentException::what(MissingArgumentException *this)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  psVar1 = &this->mWhat;
  ::std::__cxx11::string::assign((char *)psVar1);
  if ((this->mParam)._M_string_length != 0) {
    ::std::operator+(&local_30,": ",&this->mParam);
    ::std::__cxx11::string::append((string *)psVar1);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  return (psVar1->_M_dataplus)._M_p;
}

Assistant:

virtual const char* what() const NOEXCEPT override
        {
			mWhat = "Missing argument";
			if (mParam.length() > 0)
				mWhat += ": " + mParam;
            return mWhat.c_str();
        }